

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  *(undefined ***)&(this->super_IfcStructuralConnection).field_0x140 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(char **)&this->field_0x150 = "IfcStructuralCurveConnection";
  IfcStructuralConnection::IfcStructuralConnection
            (&this->super_IfcStructuralConnection,&PTR_construction_vtable_24__007755d8);
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x7754a8;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x7755c0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0x7754d0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0x7754f8;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0xd0 = 0x775520;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x100 = 0x775548;
  (this->super_IfcStructuralConnection).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x775570;
  *(undefined8 *)
   &(this->super_IfcStructuralConnection).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>.field_0x20 = 0x775598;
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}